

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dynamics.cpp
# Opt level: O1

bool iDynTree::ArticulatedBodyAlgorithm
               (Model *model,Traversal *traversal,FreeFloatingPos *robotPos,
               FreeFloatingVel *robotVel,LinkNetExternalWrenches *linkExtWrenches,
               JointDOFsDoubleArray *jointTorques,ArticulatedBodyAlgorithmInternalBuffers *bufs,
               FreeFloatingAcc *robotAcc)

{
  LinkVelArray *this;
  DOFSpatialForceArray *this_00;
  JointDOFsDoubleArray *this_01;
  LinkArticulatedBodyInertias *this_02;
  LinkWrenches *this_03;
  LinkAccArray *this_04;
  bool bVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  uint uVar6;
  int iVar7;
  PointerType ptr;
  Link *pLVar8;
  LinkIndex LVar9;
  Link *this_05;
  IJoint *pIVar10;
  LinkIndex LVar11;
  size_t sVar12;
  SpatialMotionVector *pSVar13;
  VectorDynSize *pVVar14;
  JointPosDoubleArray *pJVar15;
  undefined4 extraout_var_00;
  Twist *pTVar16;
  SpatialAcc *pSVar17;
  Twist *this_06;
  LinkIndex LVar18;
  undefined4 extraout_var_01;
  SpatialInertia *pSVar19;
  ArticulatedBodyInertia *pAVar20;
  Wrench *pWVar21;
  undefined4 extraout_var_02;
  SpatialForceVector *pSVar22;
  double *pdVar23;
  undefined4 extraout_var_03;
  ulong dof;
  undefined4 extraout_var_05;
  SpatialAcc *pSVar24;
  undefined4 extraout_var_06;
  ulong uVar25;
  SpatialMotionVector ret;
  Wrench pa;
  Twist vj;
  Transform parent_X_visited;
  double local_3b8;
  undefined1 local_398 [8];
  double dStack_390;
  double dStack_388;
  double dStack_380;
  double dStack_378;
  double local_370;
  undefined8 uStack_368;
  Wrench local_2c0;
  undefined1 local_288 [32];
  double local_268;
  double dStack_260;
  ArticulatedBodyInertia local_1b0 [56];
  SpatialInertia local_178 [2];
  SpatialForceVector local_a0 [56];
  Wrench local_68;
  undefined4 extraout_var;
  undefined4 extraout_var_04;
  
  uVar6 = Traversal::getNrOfVisitedLinks(traversal);
  if (uVar6 != 0) {
    this = &bufs->linksVel;
    uVar25 = 0;
    do {
      pLVar8 = Traversal::getLink(traversal,uVar25);
      LVar9 = Link::getIndex(pLVar8);
      this_05 = Traversal::getParentLink(traversal,uVar25);
      pIVar10 = Traversal::getParentJoint(traversal,uVar25);
      if (this_05 == (Link *)0x0) {
        pTVar16 = FreeFloatingVel::baseVel(robotVel);
        this_06 = LinkVelArray::operator()(this,LVar9);
        iDynTree::Twist::operator=(this_06,pTVar16);
LAB_0013cc94:
        local_370 = 0.0;
        dStack_378 = 0.0;
        dStack_380 = 0.0;
        dStack_388 = 0.0;
        dStack_390 = 0.0;
        local_398 = (undefined1  [8])0x0;
        iDynTree::SpatialAcc::SpatialAcc((SpatialAcc *)local_288,(SpatialMotionVector *)local_398);
        pSVar17 = LinkAccArray::operator()(&bufs->linksBiasAcceleration,LVar9);
        iDynTree::SpatialAcc::operator=(pSVar17,(SpatialAcc *)local_288);
      }
      else {
        LVar11 = Link::getIndex(this_05);
        iVar7 = (*pIVar10->_vptr_IJoint[4])(pIVar10);
        if (iVar7 == 0) {
          pJVar15 = FreeFloatingPos::jointPos(robotPos);
          LVar18 = Link::getIndex(this_05);
          iVar7 = (*pIVar10->_vptr_IJoint[10])(pIVar10,pJVar15,LVar9,LVar18);
          LinkVelArray::operator()(this,LVar11);
          iDynTree::Transform::operator*
                    ((Transform *)local_288,(Twist *)CONCAT44(extraout_var_01,iVar7));
          pTVar16 = LinkVelArray::operator()(this,LVar9);
          iDynTree::Twist::operator=(pTVar16,(Twist *)local_288);
          goto LAB_0013cc94;
        }
        iVar7 = (*pIVar10->_vptr_IJoint[0x18])(pIVar10);
        sVar12 = CONCAT44(extraout_var,iVar7);
        (*pIVar10->_vptr_IJoint[0xc])((Twist *)local_288,pIVar10,0,LVar9,LVar11);
        pSVar13 = DOFSpatialMotionArray::operator()(&bufs->S,sVar12);
        (pSVar13->super_SpatialVector<iDynTree::SpatialMotionVector>).linearVec3.super_Vector3.
        m_data[0] = (double)local_288._0_8_;
        (pSVar13->super_SpatialVector<iDynTree::SpatialMotionVector>).linearVec3.super_Vector3.
        m_data[1] = (double)local_288._8_8_;
        (pSVar13->super_SpatialVector<iDynTree::SpatialMotionVector>).linearVec3.super_Vector3.
        m_data[2] = (double)local_288._16_8_;
        (pSVar13->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3.super_Vector3.
        m_data[0] = (double)local_288._24_8_;
        (pSVar13->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3.super_Vector3.
        m_data[1] = local_268;
        (pSVar13->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3.super_Vector3.
        m_data[2] = dStack_260;
        iDynTree::Twist::Twist((Twist *)local_288);
        pVVar14 = &FreeFloatingVel::jointVel(robotVel)->super_VectorDynSize;
        local_3b8 = (double)iDynTree::VectorDynSize::operator()(pVVar14,sVar12);
        pSVar13 = DOFSpatialMotionArray::operator()(&bufs->S,sVar12);
        dVar5 = (pSVar13->super_SpatialVector<iDynTree::SpatialMotionVector>).linearVec3.
                super_Vector3.m_data[1] * local_3b8;
        local_288._8_4_ = SUB84(dVar5,0);
        local_288._0_8_ =
             (pSVar13->super_SpatialVector<iDynTree::SpatialMotionVector>).linearVec3.super_Vector3.
             m_data[0] * local_3b8;
        local_288._12_4_ = (int)((ulong)dVar5 >> 0x20);
        local_288._16_8_ =
             local_3b8 *
             (pSVar13->super_SpatialVector<iDynTree::SpatialMotionVector>).linearVec3.super_Vector3.
             m_data[2];
        pVVar14 = &FreeFloatingVel::jointVel(robotVel)->super_VectorDynSize;
        local_3b8 = (double)iDynTree::VectorDynSize::operator()(pVVar14,sVar12);
        pSVar13 = DOFSpatialMotionArray::operator()(&bufs->S,sVar12);
        dVar5 = (pSVar13->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3.
                super_Vector3.m_data[1] * local_3b8;
        unique0x10000ae6 = SUB84(dVar5,0);
        local_288._24_8_ =
             (pSVar13->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3.super_Vector3
             .m_data[0] * local_3b8;
        unique0x10000aea = (int)((ulong)dVar5 >> 0x20);
        dStack_260 = local_3b8 *
                     (pSVar13->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3.
                     super_Vector3.m_data[2];
        pJVar15 = FreeFloatingPos::jointPos(robotPos);
        iVar7 = (*pIVar10->_vptr_IJoint[10])(pIVar10,pJVar15,LVar9,LVar11);
        LinkVelArray::operator()(this,LVar11);
        iDynTree::Transform::operator*
                  ((Transform *)local_178,(Twist *)CONCAT44(extraout_var_00,iVar7));
        iDynTree::Twist::operator+((Twist *)local_398,(Twist *)local_178);
        pTVar16 = LinkVelArray::operator()(this,LVar9);
        iDynTree::Twist::operator=(pTVar16,(Twist *)local_398);
        pTVar16 = LinkVelArray::operator()(this,LVar9);
        iDynTree::Twist::operator*((Twist *)local_398,pTVar16);
        pSVar17 = LinkAccArray::operator()(&bufs->linksBiasAcceleration,LVar9);
        iDynTree::SpatialAcc::operator=(pSVar17,(SpatialAcc *)local_398);
      }
      pSVar19 = Link::getInertia(pLVar8);
      iDynTree::ArticulatedBodyInertia::ArticulatedBodyInertia
                ((ArticulatedBodyInertia *)local_288,pSVar19);
      pAVar20 = LinkArticulatedBodyInertias::operator()(&bufs->linkABIs,LVar9);
      memcpy(pAVar20,(ArticulatedBodyInertia *)local_288,0xd8);
      pTVar16 = LinkVelArray::operator()(this,LVar9);
      pSVar19 = Link::getInertia(pLVar8);
      LinkVelArray::operator()(this,LVar9);
      iDynTree::SpatialInertia::operator*(local_178,(Twist *)pSVar19);
      iDynTree::Twist::operator*((Twist *)local_398,(SpatialMomentum *)pTVar16);
      LinkWrenches::operator()(linkExtWrenches,LVar9);
      iDynTree::Wrench::operator-((Wrench *)local_288,(Wrench *)local_398);
      pWVar21 = LinkWrenches::operator()(&bufs->linksBiasWrench,LVar9);
      iDynTree::Wrench::operator=(pWVar21,(Wrench *)local_288);
      iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)local_288);
      iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)local_398);
      iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)local_178);
      uVar25 = uVar25 + 1;
      uVar6 = Traversal::getNrOfVisitedLinks(traversal);
    } while (uVar25 < uVar6);
  }
  uVar6 = Traversal::getNrOfVisitedLinks(traversal);
  if (-1 < (int)(uVar6 - 1)) {
    this_02 = &bufs->linkABIs;
    this_00 = &bufs->U;
    this_01 = &bufs->D;
    this_03 = &bufs->linksBiasWrench;
    uVar25 = (ulong)(uVar6 - 1);
    do {
      pLVar8 = Traversal::getLink(traversal,uVar25);
      LVar9 = Link::getIndex(pLVar8);
      pLVar8 = Traversal::getParentLink(traversal,uVar25);
      pIVar10 = Traversal::getParentJoint(traversal,uVar25);
      if (pLVar8 != (Link *)0x0) {
        iDynTree::ArticulatedBodyInertia::ArticulatedBodyInertia
                  ((ArticulatedBodyInertia *)local_288);
        local_2c0._40_8_ = 0;
        local_2c0._48_8_ = 0;
        local_2c0._24_8_ = 0;
        local_2c0._32_8_ = 0;
        local_2c0._8_8_ = 0;
        local_2c0._16_8_ = 0;
        local_2c0._0_8_ = &PTR__SpatialForceVector_00184f48;
        iVar7 = (*pIVar10->_vptr_IJoint[4])(pIVar10);
        if (iVar7 != 0) {
          iVar7 = (*pIVar10->_vptr_IJoint[0x18])(pIVar10);
          sVar12 = CONCAT44(extraout_var_02,iVar7);
          pAVar20 = LinkArticulatedBodyInertias::operator()(this_02,LVar9);
          DOFSpatialMotionArray::operator()(&bufs->S,sVar12);
          iDynTree::ArticulatedBodyInertia::operator*
                    ((ArticulatedBodyInertia *)local_398,(SpatialMotionVector *)pAVar20);
          pSVar22 = DOFSpatialForceArray::operator()(this_00,sVar12);
          *(double *)(pSVar22 + 0x28) = local_370;
          *(undefined8 *)(pSVar22 + 0x30) = uStack_368;
          *(double *)(pSVar22 + 0x18) = dStack_380;
          *(double *)(pSVar22 + 0x20) = dStack_378;
          *(double *)(pSVar22 + 8) = dStack_390;
          *(double *)(pSVar22 + 0x10) = dStack_388;
          iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)local_398);
          pSVar13 = DOFSpatialMotionArray::operator()(&bufs->S,sVar12);
          DOFSpatialForceArray::operator()(this_00,sVar12);
          dVar5 = (double)iDynTree::GeomVector3::dot((GeomVector3 *)pSVar13);
          dVar2 = (double)iDynTree::GeomVector3::dot
                                    (&(pSVar13->super_SpatialVector<iDynTree::SpatialMotionVector>).
                                      angularVec3);
          pdVar23 = (double *)
                    iDynTree::VectorDynSize::operator()(&this_01->super_VectorDynSize,sVar12);
          *pdVar23 = dVar5 + dVar2;
          dVar5 = (double)iDynTree::VectorDynSize::operator()
                                    (&jointTorques->super_VectorDynSize,sVar12);
          pSVar13 = DOFSpatialMotionArray::operator()(&bufs->S,sVar12);
          LinkWrenches::operator()(this_03,LVar9);
          dVar2 = (double)iDynTree::GeomVector3::dot((GeomVector3 *)pSVar13);
          dVar3 = (double)iDynTree::GeomVector3::dot
                                    (&(pSVar13->super_SpatialVector<iDynTree::SpatialMotionVector>).
                                      angularVec3);
          pdVar23 = (double *)
                    iDynTree::VectorDynSize::operator()(&(bufs->u).super_VectorDynSize,sVar12);
          *pdVar23 = dVar5 - (dVar2 + dVar3);
          pAVar20 = LinkArticulatedBodyInertias::operator()(this_02,LVar9);
          DOFSpatialForceArray::operator()(this_00,sVar12);
          pdVar23 = (double *)
                    iDynTree::VectorDynSize::operator()(&this_01->super_VectorDynSize,sVar12);
          iDynTree::ArticulatedBodyInertia::ABADyadHelper((SpatialForceVector *)local_178,*pdVar23);
          iDynTree::ArticulatedBodyInertia::operator-((ArticulatedBodyInertia *)local_398,pAVar20);
          memcpy(local_288,local_398,0xd8);
          pWVar21 = LinkWrenches::operator()(this_03,LVar9);
          LinkAccArray::operator()(&bufs->linksBiasAcceleration,LVar9);
          iDynTree::ArticulatedBodyInertia::operator*(local_1b0,(SpatialAcc *)local_288);
          iDynTree::Wrench::operator+((Wrench *)local_178,pWVar21);
          DOFSpatialForceArray::operator()(this_00,sVar12);
          pdVar23 = (double *)
                    iDynTree::VectorDynSize::operator()(&(bufs->u).super_VectorDynSize,sVar12);
          dVar5 = *pdVar23;
          pdVar23 = (double *)
                    iDynTree::VectorDynSize::operator()(&this_01->super_VectorDynSize,sVar12);
          iDynTree::SpatialForceVector::operator*(local_a0,dVar5 / *pdVar23);
          iDynTree::Wrench::Wrench(&local_68,local_a0);
          iDynTree::Wrench::operator+((Wrench *)local_398,(Wrench *)local_178);
          iDynTree::Wrench::operator=(&local_2c0,(Wrench *)local_398);
          iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)local_398);
          iDynTree::SpatialForceVector::~SpatialForceVector(&local_68.super_SpatialForceVector);
          iDynTree::SpatialForceVector::~SpatialForceVector(local_a0);
          iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)local_178);
          iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)local_1b0);
        }
        iVar7 = (*pIVar10->_vptr_IJoint[4])(pIVar10);
        if (iVar7 == 0) {
          pAVar20 = LinkArticulatedBodyInertias::operator()(this_02,LVar9);
          memcpy(local_288,pAVar20,0xd8);
          pWVar21 = LinkWrenches::operator()(this_03,LVar9);
          LinkAccArray::operator()(&bufs->linksBiasAcceleration,LVar9);
          iDynTree::ArticulatedBodyInertia::operator*
                    ((ArticulatedBodyInertia *)local_178,(SpatialAcc *)local_288);
          iDynTree::Wrench::operator+((Wrench *)local_398,pWVar21);
          iDynTree::Wrench::operator=(&local_2c0,(Wrench *)local_398);
          iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)local_398);
          iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)local_178);
        }
        LVar11 = Link::getIndex(pLVar8);
        pJVar15 = FreeFloatingPos::jointPos(robotPos);
        iVar7 = (*pIVar10->_vptr_IJoint[10])(pIVar10,pJVar15,LVar11,LVar9);
        iDynTree::Transform::Transform
                  ((Transform *)local_178,(Transform *)CONCAT44(extraout_var_03,iVar7));
        iDynTree::Transform::operator*((Transform *)local_398,(ArticulatedBodyInertia *)local_178);
        pAVar20 = LinkArticulatedBodyInertias::operator()(this_02,LVar11);
        iDynTree::ArticulatedBodyInertia::operator+=(pAVar20,(ArticulatedBodyInertia *)local_398);
        pWVar21 = LinkWrenches::operator()(this_03,LVar11);
        iDynTree::Transform::operator*((Transform *)local_1b0,(Wrench *)local_178);
        iDynTree::Wrench::operator+((Wrench *)local_398,pWVar21);
        pWVar21 = LinkWrenches::operator()(this_03,LVar11);
        iDynTree::Wrench::operator=(pWVar21,(Wrench *)local_398);
        iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)local_398);
        iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)local_1b0);
        iDynTree::SpatialForceVector::~SpatialForceVector(&local_2c0.super_SpatialForceVector);
      }
      bVar1 = 0 < (long)uVar25;
      uVar25 = uVar25 - 1;
    } while (bVar1);
  }
  uVar6 = Traversal::getNrOfVisitedLinks(traversal);
  if (uVar6 != 0) {
    this_04 = &bufs->linksAccelerations;
    uVar25 = 0;
    do {
      pLVar8 = Traversal::getLink(traversal,uVar25);
      LVar9 = Link::getIndex(pLVar8);
      pLVar8 = Traversal::getParentLink(traversal,uVar25);
      pIVar10 = Traversal::getParentJoint(traversal,uVar25);
      if (pLVar8 == (Link *)0x0) {
        LinkArticulatedBodyInertias::operator()(&bufs->linkABIs,LVar9);
        LinkWrenches::operator()(&bufs->linksBiasWrench,LVar9);
        iDynTree::ArticulatedBodyInertia::applyInverse((Wrench *)local_398);
        iDynTree::SpatialAcc::operator-((SpatialAcc *)local_288);
        pSVar17 = LinkAccArray::operator()(this_04,LVar9);
        iDynTree::SpatialAcc::operator=(pSVar17,(SpatialAcc *)local_288);
        pSVar17 = LinkAccArray::operator()(this_04,LVar9);
        pSVar24 = FreeFloatingAcc::baseAcc(robotAcc);
      }
      else {
        LVar11 = Link::getIndex(pLVar8);
        iVar7 = (*pIVar10->_vptr_IJoint[4])(pIVar10);
        if (iVar7 == 0) {
          pJVar15 = FreeFloatingPos::jointPos(robotPos);
          iVar7 = (*pIVar10->_vptr_IJoint[10])(pIVar10,pJVar15,LVar9,LVar11);
          LinkAccArray::operator()(this_04,LVar11);
          iDynTree::Transform::operator*
                    ((Transform *)local_398,(SpatialAcc *)CONCAT44(extraout_var_06,iVar7));
          LinkAccArray::operator()(&bufs->linksBiasAcceleration,LVar9);
          pSVar17 = (SpatialAcc *)local_288;
          iDynTree::SpatialAcc::operator+(pSVar17,(SpatialAcc *)local_398);
          pSVar24 = LinkAccArray::operator()(this_04,LVar9);
        }
        else {
          iVar7 = (*pIVar10->_vptr_IJoint[0x18])(pIVar10);
          dof = CONCAT44(extraout_var_04,iVar7);
          pJVar15 = FreeFloatingPos::jointPos(robotPos);
          iVar7 = (*pIVar10->_vptr_IJoint[10])(pIVar10,pJVar15,LVar9,LVar11);
          LinkAccArray::operator()(this_04,LVar11);
          iDynTree::Transform::operator*
                    ((Transform *)local_398,(SpatialAcc *)CONCAT44(extraout_var_05,iVar7));
          LinkAccArray::operator()(&bufs->linksBiasAcceleration,LVar9);
          iDynTree::SpatialAcc::operator+((SpatialAcc *)local_288,(SpatialAcc *)local_398);
          pSVar17 = LinkAccArray::operator()(this_04,LVar9);
          iDynTree::SpatialAcc::operator=(pSVar17,(SpatialAcc *)local_288);
          pdVar23 = (double *)
                    iDynTree::VectorDynSize::operator()(&(bufs->u).super_VectorDynSize,dof);
          dVar5 = *pdVar23;
          pSVar22 = DOFSpatialForceArray::operator()(&bufs->U,dof);
          LinkAccArray::operator()(this_04,LVar9);
          dVar3 = (double)iDynTree::GeomVector3::dot((GeomVector3 *)(pSVar22 + 8));
          dVar4 = (double)iDynTree::GeomVector3::dot((GeomVector3 *)(pSVar22 + 0x20));
          pdVar23 = (double *)
                    iDynTree::VectorDynSize::operator()(&(bufs->D).super_VectorDynSize,dof);
          dVar2 = *pdVar23;
          pVVar14 = &FreeFloatingAcc::jointAcc(robotAcc)->super_VectorDynSize;
          pdVar23 = (double *)iDynTree::VectorDynSize::operator()(pVVar14,dof);
          *pdVar23 = (dVar5 - (dVar4 + dVar3)) / dVar2;
          pSVar24 = LinkAccArray::operator()(this_04,LVar9);
          DOFSpatialMotionArray::operator()(&bufs->S,dof);
          pVVar14 = &FreeFloatingAcc::jointAcc(robotAcc)->super_VectorDynSize;
          pdVar23 = (double *)iDynTree::VectorDynSize::operator()(pVVar14,dof);
          iDynTree::SpatialMotionVector::operator*((SpatialMotionVector *)local_178,*pdVar23);
          iDynTree::SpatialAcc::SpatialAcc((SpatialAcc *)local_398,(SpatialMotionVector *)local_178)
          ;
          pSVar17 = (SpatialAcc *)local_288;
          iDynTree::SpatialAcc::operator+(pSVar17,pSVar24);
          pSVar24 = LinkAccArray::operator()(this_04,LVar9);
        }
      }
      iDynTree::SpatialAcc::operator=(pSVar24,pSVar17);
      uVar25 = uVar25 + 1;
      uVar6 = Traversal::getNrOfVisitedLinks(traversal);
    } while (uVar25 < uVar6);
  }
  return true;
}

Assistant:

bool ArticulatedBodyAlgorithm(const Model& model,
                              const Traversal& traversal,
                              const FreeFloatingPos& robotPos,
                              const FreeFloatingVel& robotVel,
                              const LinkNetExternalWrenches & linkExtWrenches,
                              const JointDOFsDoubleArray & jointTorques,
                                    ArticulatedBodyAlgorithmInternalBuffers & bufs,
                                    FreeFloatingAcc & robotAcc)
{
    /**
     * Forward pass: compute the link velocities and the link bias accelerations
     * and initialize the Articulated Body Inertia and the articulated bias wrench.
     */
    for(unsigned int traversalEl=0; traversalEl < traversal.getNrOfVisitedLinks(); traversalEl++)
    {
        LinkConstPtr visitedLink = traversal.getLink(traversalEl);
        LinkIndex visitedLinkIndex = visitedLink->getIndex();
        LinkConstPtr parentLink  = traversal.getParentLink(traversalEl);
        IJointConstPtr toParentJoint = traversal.getParentJoint(traversalEl);

        // Propagate velocities and bias accelerations

        // If the visitedLink is the base one, initialize the velocity with the input velocity
        if( parentLink == 0 )
        {
            assert(visitedLinkIndex >= 0 && visitedLinkIndex < (LinkIndex)model.getNrOfLinks());
            bufs.linksVel(visitedLinkIndex) = robotVel.baseVel();
            bufs.linksBiasAcceleration(visitedLinkIndex) = SpatialAcc::Zero();
        }
        else
        {
            LinkIndex    parentLinkIndex = parentLink->getIndex();
            // Otherwise we propagate velocity in the usual way
            if( toParentJoint->getNrOfDOFs() == 0 )
            {
                bufs.linksVel(visitedLinkIndex) =
                    toParentJoint->getTransform(robotPos.jointPos(),visitedLinkIndex,parentLink->getIndex())*bufs.linksVel(parentLinkIndex);
                bufs.linksBiasAcceleration(visitedLinkIndex) = SpatialAcc::Zero();
            }
            else
            {
                size_t dofIndex = toParentJoint->getDOFsOffset();
                bufs.S(dofIndex) = toParentJoint->getMotionSubspaceVector(0,visitedLinkIndex,parentLinkIndex);
                Twist vj;
                toEigen(vj.getLinearVec3()) = robotVel.jointVel()(dofIndex)*toEigen(bufs.S(dofIndex).getLinearVec3());
                toEigen(vj.getAngularVec3()) = robotVel.jointVel()(dofIndex)*toEigen(bufs.S(dofIndex).getAngularVec3());
                bufs.linksVel(visitedLinkIndex) =
                    toParentJoint->getTransform(robotPos.jointPos(),visitedLinkIndex,parentLinkIndex)*bufs.linksVel(parentLinkIndex)
                    + vj;
                bufs.linksBiasAcceleration(visitedLinkIndex) = bufs.linksVel(visitedLinkIndex)*vj;

            }
        }

        // Initialize Articulated Body Inertia
        bufs.linkABIs(visitedLinkIndex) = visitedLink->getInertia();

        // Initialize bias force (note that we assume that the external frames are
        // expressed in a local frame, differently from Featherstone 2008
        bufs.linksBiasWrench(visitedLinkIndex) = bufs.linksVel(visitedLinkIndex)*(visitedLink->getInertia()*bufs.linksVel(visitedLinkIndex))
                                            - linkExtWrenches(visitedLinkIndex);
    }

    /*
     * Backward pass: recursivly compute
     * the articulated body inertia and the articulated body bias wrench.
     *
     */
    for(int traversalEl = traversal.getNrOfVisitedLinks()-1; traversalEl >= 0; traversalEl--)
    {
        LinkConstPtr visitedLink = traversal.getLink(traversalEl);
        LinkIndex    visitedLinkIndex = visitedLink->getIndex();
        LinkConstPtr parentLink  = traversal.getParentLink(traversalEl);
        IJointConstPtr toParentJoint = traversal.getParentJoint(traversalEl);

        if( parentLink )
        {
            ArticulatedBodyInertia Ia;
            Wrench pa;

            // For now we support only 0 and 1 dof joints

            // for 1 dof joints, the articulated inertia
            // need to be propagated to the parent considering
            // the joints
            if( toParentJoint->getNrOfDOFs() > 0 )
            {
                assert(toParentJoint->getNrOfDOFs()==1);
                size_t dofIndex = toParentJoint->getDOFsOffset();
                bufs.U(dofIndex) = bufs.linkABIs(visitedLinkIndex)*bufs.S(dofIndex);
                bufs.D(dofIndex) = bufs.S(dofIndex).dot(bufs.U(dofIndex));
                bufs.u(dofIndex) = jointTorques(dofIndex) - bufs.S(dofIndex).dot(bufs.linksBiasWrench(visitedLinkIndex));

                Ia = bufs.linkABIs(visitedLinkIndex) - ArticulatedBodyInertia::ABADyadHelper(bufs.U(dofIndex),bufs.D(dofIndex));

                pa                 =   bufs.linksBiasWrench(visitedLinkIndex)
                                     + Ia*bufs.linksBiasAcceleration(visitedLinkIndex)
                                     + bufs.U(dofIndex)*(bufs.u(dofIndex)/bufs.D(dofIndex));

            }

            // For fixed joints, we just need to propate
            // the articulated quantities without considering the
            // joint
            if( toParentJoint->getNrOfDOFs() == 0 )
            {
                Ia = bufs.linkABIs(visitedLinkIndex);
                pa                 =   bufs.linksBiasWrench(visitedLinkIndex)
                                     + Ia*bufs.linksBiasAcceleration(visitedLinkIndex);
            }

            //bufs.pa(visitedLinkIndex) = pa;

            // Propagate
            LinkIndex parentLinkIndex = parentLink->getIndex();
            Transform parent_X_visited = toParentJoint->getTransform(robotPos.jointPos(),parentLinkIndex,visitedLinkIndex);
            bufs.linkABIs(parentLinkIndex)        += parent_X_visited*Ia;
            bufs.linksBiasWrench(parentLinkIndex) = bufs.linksBiasWrench(parentLinkIndex) + parent_X_visited*pa;
        }
    }

    /**
     * Second forward pass: find robot accelerations
     *
     */
    // \todo TODO Handle gravity
    for(unsigned int traversalEl=0; traversalEl < traversal.getNrOfVisitedLinks(); traversalEl++)
    {
       LinkConstPtr visitedLink = traversal.getLink(traversalEl);
       LinkIndex visitedLinkIndex = visitedLink->getIndex();
       LinkConstPtr parentLink  = traversal.getParentLink(traversalEl);
       IJointConstPtr toParentJoint = traversal.getParentJoint(traversalEl);

       if( parentLink == 0 )
       {
           // Preliminary step: find base acceleration
           bufs.linksAccelerations(visitedLinkIndex) = -(bufs.linkABIs(visitedLinkIndex).applyInverse(bufs.linksBiasWrench(visitedLinkIndex)));

           robotAcc.baseAcc() = bufs.linksAccelerations(visitedLinkIndex);
       }
       else
       {
           LinkIndex    parentLinkIndex = parentLink->getIndex();
           if( toParentJoint->getNrOfDOFs() > 0 )
           {
               size_t dofIndex = toParentJoint->getDOFsOffset();
               assert(toParentJoint->getNrOfDOFs()==1);
               bufs.linksAccelerations(visitedLinkIndex) =
                   toParentJoint->getTransform(robotPos.jointPos(),visitedLinkIndex,parentLinkIndex)*bufs.linksAccelerations(parentLinkIndex)
                   + bufs.linksBiasAcceleration(visitedLinkIndex);
               robotAcc.jointAcc()(dofIndex) = (bufs.u(dofIndex)-bufs.U(dofIndex).dot(bufs.linksAccelerations(visitedLinkIndex)))/bufs.D(dofIndex);
               bufs.linksAccelerations(visitedLinkIndex) = bufs.linksAccelerations(visitedLinkIndex) + bufs.S(dofIndex)*robotAcc.jointAcc()(dofIndex);
           }
           else
           {
               //for fixed joints we just propagate the acceleration
               bufs.linksAccelerations(visitedLinkIndex) =
                   toParentJoint->getTransform(robotPos.jointPos(),visitedLinkIndex,parentLinkIndex)*bufs.linksAccelerations(parentLinkIndex)
                   + bufs.linksBiasAcceleration(visitedLinkIndex);
           }
       }
    }

    return true;
}